

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O2

void Fxu_CreateCovers(Fxu_Matrix *p,Fxu_Data_t *pData)

{
  void **ppvVar1;
  int iVar2;
  Fxu_Lit *pFVar3;
  Fxu_Cube *pFVar4;
  long lVar5;
  Fxu_Cube *pFVar6;
  long lVar7;
  int iVar8;
  Fxu_Cube *pCubeFirst;
  
  lVar7 = 0;
  pFVar4 = Fxu_CreateCoversFirstCube(p,pData,0);
  do {
    pCubeFirst = pFVar4;
    iVar8 = pData->nNodesOld;
    lVar5 = lVar7;
    do {
      if (iVar8 <= lVar5) {
        for (iVar8 = 0; iVar8 < pData->nNodesNew; iVar8 = iVar8 + 1) {
          iVar2 = pData->nNodesOld;
          pFVar4 = Fxu_CreateCoversFirstCube(p,pData,iVar2 + iVar8 + 1);
          Fxu_CreateCoversNode(p,pData,iVar2 + iVar8,pCubeFirst,pFVar4);
          pCubeFirst = pFVar4;
        }
        return;
      }
      lVar7 = lVar5 + 1;
      ppvVar1 = pData->vSops->pArray + lVar5;
      lVar5 = lVar7;
    } while (*ppvVar1 == (void *)0x0);
    pFVar4 = Fxu_CreateCoversFirstCube(p,pData,(int)lVar7);
    for (pFVar6 = pCubeFirst; pFVar6 != pFVar4; pFVar6 = pFVar6->pNext) {
      pFVar3 = (pFVar6->lLits).pTail;
      if ((pFVar3 != (Fxu_Lit *)0x0) &&
         (iVar2 = pFVar3->iVar, SBORROW4(iVar2,iVar8 * 2) == iVar2 + iVar8 * -2 < 0)) {
        Fxu_CreateCoversNode(p,pData,(int)lVar7 + -1,pCubeFirst,pFVar4);
        break;
      }
    }
  } while( true );
}

Assistant:

void Fxu_CreateCovers( Fxu_Matrix * p, Fxu_Data_t * pData )
{
    Fxu_Cube * pCube, * pCubeFirst, * pCubeNext;
    char * pSopCover;
    int iNode, n;

    // get the first cube of the first internal node 
    pCubeFirst = Fxu_CreateCoversFirstCube( p, pData, 0 );

    // go through the internal nodes
    for ( n = 0; n < pData->nNodesOld; n++ )
    if ( (pSopCover = (char *)pData->vSops->pArray[n]) )
    {
        // get the number of this node
        iNode = n;
        // get the next first cube
        pCubeNext = Fxu_CreateCoversFirstCube(  p, pData, iNode + 1 );
        // check if there any new variables in these cubes
        for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
            if ( pCube->lLits.pTail && pCube->lLits.pTail->iVar >= 2 * pData->nNodesOld )
                break;
        if ( pCube != pCubeNext )
            Fxu_CreateCoversNode( p, pData, iNode, pCubeFirst, pCubeNext );
        // update the first cube
        pCubeFirst = pCubeNext;
    }

    // add the covers for the extracted nodes
    for ( n = 0; n < pData->nNodesNew; n++ )
    {
        // get the number of this node
        iNode = pData->nNodesOld + n;
        // get the next first cube
        pCubeNext = Fxu_CreateCoversFirstCube( p, pData, iNode + 1 );
        // the node should be added
        Fxu_CreateCoversNode( p, pData, iNode, pCubeFirst, pCubeNext );
        // update the first cube
        pCubeFirst = pCubeNext;
    }
}